

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O2

int do_lea(void)

{
  byte bVar1;
  char pram;
  int16_t pram_00;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  undefined4 *puVar5;
  byte bVar6;
  
  uVar2 = registe_ptr->IP;
  bVar1 = code_ptr[uVar2 + 2];
  bVar3 = bVar1 >> 4;
  bVar6 = bVar1 & 0xf;
  if (code_ptr[uVar2 + 1] == '\x01') {
    if (bVar6 == 2) {
      uVar2 = *(uint *)(code_ptr + (ulong)uVar2 + 3);
      *register_list[bVar3] = uVar2;
      set_flag(uVar2);
    }
    else if (bVar6 == 1) {
      pram_00 = *(int16_t *)(code_ptr + (ulong)uVar2 + 3);
      *(int16_t *)register_list[bVar3] = pram_00;
      set_flag(pram_00);
    }
    else {
      if ((bVar1 & 0xf) != 0) goto LAB_00102dcc;
      pram = code_ptr[uVar2 + 3];
      *(char *)register_list[bVar3] = pram;
      set_flag(pram);
    }
  }
  else {
    if (code_ptr[uVar2 + 1] != '\0') {
LAB_00102dcc:
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 0xf6;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
    bVar4 = (byte)code_ptr[uVar2 + 3] >> 4;
    if (bVar6 == 2) {
      *register_list[bVar3] = *register_list[bVar4];
    }
    else if (bVar6 == 1) {
      *(short *)register_list[bVar3] = (short)*register_list[bVar4];
    }
    else if ((bVar1 & 0xf) == 0) {
      *(char *)register_list[bVar3] = (char)*register_list[bVar4];
    }
  }
  return 1;
}

Assistant:

int do_lea() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	switch (code_ptr[registe_ptr->IP + 1])//操作类型
	{
	case '\x00': {
		//
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra = *Rb;
			break;
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra = *Rb;
			break;
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra = *Rb;
			break;
		}
		break;
	}
	case '\x01': {//
		if (low == 0)//低位运算
		{
			unsigned temp = code_ptr[registe_ptr->IP + 2 + 1];//获得立即数
			char *R = (char *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(short*)(code_ptr+registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr+registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	default: {
		throw(LVM_EXECUTE_ERROR);
		break;
	}
	}
	return LVM_SUCCESS;
}